

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

int Sbd_ManDelay(Sbd_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  Gia_Obj_t *pObj;
  int v;
  int iVar2;
  
  iVar2 = 0;
  for (v = 0; p_00 = p->pGia, v < p_00->vCos->nSize; v = v + 1) {
    pObj = Gia_ManCo(p_00,v);
    iVar1 = Gia_ObjFaninId0p(p_00,pObj);
    iVar1 = Vec_IntEntry(p->vLutLevs,iVar1);
    if (iVar2 <= iVar1) {
      iVar2 = iVar1;
    }
  }
  return iVar2;
}

Assistant:

int Sbd_ManDelay( Sbd_Man_t * p )
{
    int i, Id, Delay = 0;
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
        Delay = Abc_MaxInt( Delay, Vec_IntEntry(p->vLutLevs, Id) );
    return Delay;
}